

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplace_back<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *this,
          pair<unsigned_long,_unsigned_long> *args)

{
  iterator ppVar1;
  unsigned_long *in_RSI;
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *in_RDI;
  pair<unsigned_long,_unsigned_long> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end(in_RDI);
    local_8 = emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppVar1 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end(in_RDI);
    ppVar1->first = *in_RSI;
    ppVar1->second = in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }